

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O0

string * fs_get_cwd_abi_cxx11_(void)

{
  bool bVar1;
  string *in_RDI;
  string_view local_a8;
  string_view local_98;
  uint local_88;
  string local_78;
  __sv_type local_58;
  undefined1 local_48 [8];
  path s;
  error_code ec;
  
  std::error_code::error_code((error_code *)&s._M_cmpts);
  std::filesystem::current_path_abi_cxx11_((error_code *)local_48);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&s._M_cmpts);
  if (!bVar1) {
    std::filesystem::__cxx11::path::generic_string(&local_78,(path *)local_48);
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_78);
    fs_drop_slash_abi_cxx11_(in_RDI,local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_88 = (uint)!bVar1;
  std::filesystem::__cxx11::path::~path((path *)local_48);
  if (local_88 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"fs_get_cwd")
    ;
    fs_print_error(local_98,local_a8,(error_code *)&s._M_cmpts);
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string fs_get_cwd()
{
  // does not have trailing slash
  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  if(auto s = std::filesystem::current_path(ec); !ec) FFS_LIKELY
    return fs_drop_slash(s.generic_string());
#elif defined(_WIN32)
// windows.h https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-getcurrentdirectory
  if(DWORD L = GetCurrentDirectoryA(0, nullptr); L > 0)  FFS_LIKELY
  {
    std::string r(L, '\0');
    if(GetCurrentDirectoryA(L, r.data()) == L-1)  FFS_LIKELY
    {
      r.resize(L-1);
      return fs_as_posix(r);
    }
  }
#else
// unistd.h https://www.man7.org/linux/man-pages/man3/getcwd.3.html
  if(std::string buf(fs_get_max_path(), '\0');
      getcwd(buf.data(), buf.size()))  FFS_LIKELY
    return fs_drop_slash(fs_trim(buf));
#endif

  fs_print_error("", __func__, ec);
  return {};
}